

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lh_candidate_index_impl.h
# Opt level: O3

void __thiscall
lh_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  iterator iVar4;
  long lVar5;
  pointer piVar6;
  iterator __end2;
  __node_base *p_Var7;
  int iVar8;
  pointer ppVar9;
  iterator __begin2;
  pointer __args;
  int *piVar10;
  int pre_cand_id;
  int current_tree_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  int local_a0;
  int local_9c;
  int *local_98;
  iterator iStack_90;
  int *local_88;
  vector<int,_std::allocator<int>_> local_80;
  double local_68;
  pointer local_60;
  CandidateIndex *local_58;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  
  local_68 = distance_threshold;
  local_58 = this;
  local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_48,(long)(il_size + 1),(allocator_type *)&local_80);
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_98);
  ppVar9 = (histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != local_60) {
    do {
      local_98 = (int *)0x0;
      iStack_90._M_current = (int *)0x0;
      local_88 = (int *)0x0;
      if (((double)ppVar9->first <= local_68) && (local_a0 = 0, 0 < local_9c)) {
        do {
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_a0);
          }
          else {
            *iStack_90._M_current = local_a0;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_a0] =
               local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_a0] + 1;
          local_a0 = local_a0 + 1;
        } while (local_a0 < local_9c);
      }
      p_Var7 = &(ppVar9->second)._M_h._M_before_begin;
      while( true ) {
        iVar4._M_current = iStack_90._M_current;
        p_Var7 = p_Var7->_M_nxt;
        if (p_Var7 == (__node_base *)0x0) break;
        lVar5 = (long)(int)*(size_type *)(p_Var7 + 1);
        __args = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        ppVar1 = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (__args != ppVar1) {
          do {
            iVar3 = *(int *)((long)(p_Var7 + 1) + 4);
            if (__args->second < *(int *)((long)(p_Var7 + 1) + 4)) {
              iVar3 = __args->second;
            }
            if ((piVar6[__args->first] == 0) && (iVar3 != 0)) {
              if (iStack_90._M_current == local_88) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&__args->first);
                piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *iStack_90._M_current = __args->first;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
            iVar8 = iVar3 + piVar6[__args->first];
            if (ppVar9->first < iVar3 + piVar6[__args->first]) {
              iVar8 = ppVar9->first;
            }
            piVar6[__args->first] = iVar8;
            __args = __args + 1;
          } while (__args != ppVar1);
          lVar5 = (long)(int)*(size_type *)(p_Var7 + 1);
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   (local_48.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5),&local_9c,
                   (int *)((long)(p_Var7 + 1) + 4));
      }
      local_58->pre_candidates_ =
           local_58->pre_candidates_ + ((long)iStack_90._M_current - (long)local_98 >> 2);
      piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (piVar10 = local_98; iVar4._M_current != piVar10; piVar10 = piVar10 + 1) {
        local_a0 = *piVar10;
        lVar5 = (long)local_a0;
        ppVar2 = (histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((double)((ppVar2[lVar5].first + ppVar2[local_9c].first + piVar6[lVar5] * -2) / 2) <=
            local_68) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(local_50,&local_9c,&local_a0);
          lVar5 = (long)local_a0;
          piVar6 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar6[lVar5] = 0;
      }
      local_9c = local_9c + 1;
      if (local_98 != (int *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != local_60);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((histogram_collection[current_tree_id].first + histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }
}